

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *this;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  bool bVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  uint uVar22;
  byte bVar23;
  ulong *puVar24;
  ulong uVar25;
  long lVar26;
  size_t i;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1018 [8];
  float fStack_1010;
  float fStack_100c;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  long local_fe0;
  ulong local_fd8;
  long local_fd0;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  ulong local_f78;
  undefined4 uStack_f70;
  ulong local_f68 [487];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  
  local_f78 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  fVar2 = (context->query_radius).field_0.m128[0];
  auVar53 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1008 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar4 = (context->query_radius).field_0;
    local_1008 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  }
  puVar24 = local_f68;
  local_f88 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.x));
  auVar58 = ZEXT1664(local_f88);
  local_f98 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.y));
  auVar60 = ZEXT1664(local_f98);
  local_fa8 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.z));
  auVar62 = ZEXT1664(local_fa8);
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
  auVar63 = ZEXT1664(auVar30);
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
  auVar64 = ZEXT1664(auVar30);
  fVar2 = fVar2 * fVar2;
  auVar30._4_4_ = fVar2;
  auVar30._0_4_ = fVar2;
  auVar30._8_4_ = fVar2;
  auVar30._12_4_ = fVar2;
  bVar20 = false;
LAB_01ea9362:
  local_ff8 = auVar53._0_16_;
  auVar57 = auVar58._0_16_;
  auVar31 = vsubps_avx512vl(auVar57,local_ff8);
  auVar32 = vaddps_avx512vl(auVar57,local_ff8);
  auVar59 = auVar60._0_16_;
  local_fb8 = auVar63._0_16_;
  auVar33 = vsubps_avx512vl(auVar59,local_fb8);
  auVar34 = vaddps_avx512vl(auVar59,local_fb8);
  auVar61 = auVar62._0_16_;
  local_fc8 = auVar64._0_16_;
  auVar35 = vsubps_avx512vl(auVar61,local_fc8);
  auVar36 = vaddps_avx512vl(auVar61,local_fc8);
  while( true ) {
    pfVar1 = (float *)(puVar24 + -1);
    puVar24 = puVar24 + -2;
    if ((float)local_1008._0_4_ < *pfVar1) break;
    uVar29 = *puVar24;
LAB_01ea93a7:
    uVar22 = (uint)uVar29;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar29 & 8) != 0) {
LAB_01ea9827:
        local_fe0 = (ulong)(uVar22 & 0xf) - 8;
        if (local_fe0 == 0) break;
        lVar26 = (uVar29 & 0xfffffffffffffff0) + 0x40;
        local_fd0 = 0;
        uVar29 = 0;
        goto LAB_01ea9858;
      }
      uVar21 = uVar29 & 0xfffffffffffffff0;
      fVar2 = query->time;
      auVar40._4_4_ = fVar2;
      auVar40._0_4_ = fVar2;
      auVar40._8_4_ = fVar2;
      auVar40._12_4_ = fVar2;
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80),auVar40,
                                *(undefined1 (*) [16])(uVar21 + 0x20));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xa0),auVar40,
                                *(undefined1 (*) [16])(uVar21 + 0x40));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xc0),auVar40,
                                *(undefined1 (*) [16])(uVar21 + 0x60));
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x90),auVar40,
                                *(undefined1 (*) [16])(uVar21 + 0x30));
      auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xb0),auVar40,
                                *(undefined1 (*) [16])(uVar21 + 0x50));
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xd0),auVar40,
                                *(undefined1 (*) [16])(uVar21 + 0x70));
      auVar37 = vmaxps_avx512vl(auVar57,auVar43);
      auVar37 = vminps_avx(auVar37,auVar47);
      auVar38 = vsubps_avx512vl(auVar37,auVar57);
      auVar37 = vmaxps_avx512vl(auVar59,auVar39);
      auVar37 = vminps_avx(auVar37,auVar49);
      auVar39 = vsubps_avx512vl(auVar37,auVar59);
      auVar37 = vmaxps_avx512vl(auVar61,auVar41);
      auVar37 = vminps_avx(auVar37,auVar48);
      auVar37 = vsubps_avx512vl(auVar37,auVar61);
      local_1018._0_4_ =
           auVar38._0_4_ * auVar38._0_4_ + auVar39._0_4_ * auVar39._0_4_ +
           auVar37._0_4_ * auVar37._0_4_;
      local_1018._4_4_ =
           auVar38._4_4_ * auVar38._4_4_ + auVar39._4_4_ * auVar39._4_4_ +
           auVar37._4_4_ * auVar37._4_4_;
      fStack_1010 = auVar38._8_4_ * auVar38._8_4_ + auVar39._8_4_ * auVar39._8_4_ +
                    auVar37._8_4_ * auVar37._8_4_;
      fStack_100c = auVar38._12_4_ * auVar38._12_4_ + auVar39._12_4_ * auVar39._12_4_ +
                    auVar37._12_4_ * auVar37._12_4_;
      uVar28 = vcmpps_avx512vl(_local_1018,auVar30,2);
      uVar25 = vcmpps_avx512vl(auVar43,auVar47,2);
      uVar28 = uVar28 & uVar25;
      if ((uVar22 & 7) == 6) {
        uVar17 = vcmpps_avx512vl(auVar40,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
        uVar18 = vcmpps_avx512vl(auVar40,*(undefined1 (*) [16])(uVar21 + 0xe0),0xd);
        uVar28 = (ulong)(byte)((byte)uVar17 & (byte)uVar18 & (byte)uVar28);
      }
    }
    else {
      if ((uVar29 & 8) != 0) goto LAB_01ea9827;
      uVar25 = uVar29 & 0xfffffffffffffff0;
      fVar2 = query->time;
      auVar54._4_4_ = fVar2;
      auVar54._0_4_ = fVar2;
      auVar54._8_4_ = fVar2;
      auVar54._12_4_ = fVar2;
      auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x80),auVar54,
                                *(undefined1 (*) [16])(uVar25 + 0x20));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0xa0),auVar54,
                                *(undefined1 (*) [16])(uVar25 + 0x40));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0xc0),auVar54,
                                *(undefined1 (*) [16])(uVar25 + 0x60));
      auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0x90),auVar54,
                                *(undefined1 (*) [16])(uVar25 + 0x30));
      auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0xb0),auVar54,
                                *(undefined1 (*) [16])(uVar25 + 0x50));
      auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar25 + 0xd0),auVar54,
                                *(undefined1 (*) [16])(uVar25 + 0x70));
      auVar37 = vmaxps_avx512vl(auVar57,auVar43);
      auVar37 = vminps_avx(auVar37,auVar47);
      auVar38 = vsubps_avx512vl(auVar37,auVar57);
      auVar37 = vmaxps_avx512vl(auVar59,auVar39);
      auVar37 = vminps_avx(auVar37,auVar49);
      auVar37 = vsubps_avx512vl(auVar37,auVar59);
      auVar40 = vmaxps_avx512vl(auVar61,auVar41);
      auVar40 = vminps_avx512vl(auVar40,auVar48);
      auVar40 = vsubps_avx512vl(auVar40,auVar61);
      auVar40 = vmulps_avx512vl(auVar40,auVar40);
      local_1018._4_4_ =
           auVar38._4_4_ * auVar38._4_4_ + auVar37._4_4_ * auVar37._4_4_ + auVar40._4_4_;
      local_1018._0_4_ =
           auVar38._0_4_ * auVar38._0_4_ + auVar37._0_4_ * auVar37._0_4_ + auVar40._0_4_;
      fStack_1010 = auVar38._8_4_ * auVar38._8_4_ + auVar37._8_4_ * auVar37._8_4_ + auVar40._8_4_;
      fStack_100c = auVar38._12_4_ * auVar38._12_4_ + auVar37._12_4_ * auVar37._12_4_ +
                    auVar40._12_4_;
      uVar17 = vcmpps_avx512vl(auVar43,auVar47,2);
      uVar18 = vcmpps_avx512vl(auVar47,auVar31,1);
      uVar12 = vcmpps_avx512vl(auVar43,auVar32,6);
      uVar13 = vcmpps_avx512vl(auVar49,auVar33,1);
      uVar14 = vcmpps_avx512vl(auVar39,auVar34,6);
      uVar15 = vcmpps_avx512vl(auVar48,auVar35,1);
      uVar16 = vcmpps_avx512vl(auVar41,auVar36,6);
      bVar23 = ~((byte)uVar14 | (byte)uVar12 | (byte)uVar16 | (byte)uVar18 | (byte)uVar13 |
                (byte)uVar15) & (byte)uVar17;
      uVar28 = (ulong)bVar23;
      if ((uVar22 & 7) == 6) {
        uVar17 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [16])(uVar25 + 0xf0),1);
        uVar18 = vcmpps_avx512vl(auVar54,*(undefined1 (*) [16])(uVar25 + 0xe0),0xd);
        uVar28 = (ulong)(bVar23 & (byte)uVar17 & (byte)uVar18);
      }
    }
    if ((char)uVar28 != '\0') {
      uVar25 = uVar29 & 0xfffffffffffffff0;
      lVar26 = 0;
      for (uVar29 = uVar28; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar29 = *(ulong *)(uVar25 + lVar26 * 8);
      uVar22 = (uint)uVar28 - 1 & (uint)uVar28;
      uVar28 = (ulong)uVar22;
      if (uVar22 != 0) {
        uVar5 = *(uint *)(local_1018 + lVar26 * 4);
        lVar26 = 0;
        for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          lVar26 = lVar26 + 1;
        }
        uVar22 = uVar22 - 1 & uVar22;
        uVar21 = (ulong)uVar22;
        uVar28 = *(ulong *)(uVar25 + lVar26 * 8);
        uVar6 = *(uint *)(local_1018 + lVar26 * 4);
        if (uVar22 == 0) {
          if (uVar5 < uVar6) {
            *puVar24 = uVar28;
            *(uint *)(puVar24 + 1) = uVar6;
            puVar24 = puVar24 + 2;
          }
          else {
            *puVar24 = uVar29;
            *(uint *)(puVar24 + 1) = uVar5;
            puVar24 = puVar24 + 2;
            uVar29 = uVar28;
          }
        }
        else {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar29;
          auVar37 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar5));
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar28;
          auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar6));
          lVar26 = 0;
          for (; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            lVar26 = lVar26 + 1;
          }
          uVar22 = uVar22 - 1 & uVar22;
          uVar29 = (ulong)uVar22;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(uVar25 + lVar26 * 8);
          auVar49 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_1018 + lVar26 * 4)));
          auVar39 = vpshufd_avx(auVar37,0xaa);
          auVar41 = vpshufd_avx(auVar43,0xaa);
          auVar47 = vpshufd_avx(auVar49,0xaa);
          if (uVar22 == 0) {
            uVar29 = vpcmpgtd_avx512vl(auVar41,auVar39);
            uVar29 = uVar29 & 0xf;
            auVar41 = vpblendmd_avx512vl(auVar43,auVar37);
            bVar19 = (bool)((byte)uVar29 & 1);
            auVar42._0_4_ = (uint)bVar19 * auVar41._0_4_ | (uint)!bVar19 * auVar39._0_4_;
            bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar42._4_4_ = (uint)bVar19 * auVar41._4_4_ | (uint)!bVar19 * auVar39._4_4_;
            bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar42._8_4_ = (uint)bVar19 * auVar41._8_4_ | (uint)!bVar19 * auVar39._8_4_;
            bVar19 = SUB81(uVar29 >> 3,0);
            auVar42._12_4_ = (uint)bVar19 * auVar41._12_4_ | (uint)!bVar19 * auVar39._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar43);
            bVar19 = (bool)((byte)uVar29 & 1);
            auVar44._0_4_ = (uint)bVar19 * auVar43._0_4_ | (uint)!bVar19 * auVar37._0_4_;
            bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar44._4_4_ = (uint)bVar19 * auVar43._4_4_ | (uint)!bVar19 * auVar37._4_4_;
            bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar44._8_4_ = (uint)bVar19 * auVar43._8_4_ | (uint)!bVar19 * auVar37._8_4_;
            bVar19 = SUB81(uVar29 >> 3,0);
            auVar44._12_4_ = (uint)bVar19 * auVar43._12_4_ | (uint)!bVar19 * auVar37._12_4_;
            auVar37 = vpshufd_avx(auVar42,0xaa);
            uVar28 = vpcmpgtd_avx512vl(auVar47,auVar37);
            uVar28 = uVar28 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar49,auVar42);
            bVar19 = (bool)((byte)uVar28 & 1);
            bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
            uVar29 = CONCAT44((uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar37._4_4_,
                              (uint)bVar19 * auVar43._0_4_ | (uint)!bVar19 * auVar37._0_4_);
            auVar37 = vmovdqa32_avx512vl(auVar49);
            bVar19 = (bool)((byte)uVar28 & 1);
            auVar45._0_4_ = (uint)bVar19 * auVar37._0_4_ | !bVar19 * auVar42._0_4_;
            bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar45._4_4_ = (uint)bVar19 * auVar37._4_4_ | !bVar19 * auVar42._4_4_;
            bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar45._8_4_ = (uint)bVar19 * auVar37._8_4_ | !bVar19 * auVar42._8_4_;
            bVar19 = SUB81(uVar28 >> 3,0);
            auVar45._12_4_ = (uint)bVar19 * auVar37._12_4_ | !bVar19 * auVar42._12_4_;
            auVar37 = vpshufd_avx(auVar45,0xaa);
            auVar43 = vpshufd_avx(auVar44,0xaa);
            uVar28 = vpcmpgtd_avx512vl(auVar37,auVar43);
            uVar28 = uVar28 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar45,auVar44);
            bVar19 = (bool)((byte)uVar28 & 1);
            auVar46._0_4_ = (uint)bVar19 * auVar43._0_4_ | (uint)!bVar19 * auVar37._0_4_;
            bVar19 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar46._4_4_ = (uint)bVar19 * auVar43._4_4_ | (uint)!bVar19 * auVar37._4_4_;
            bVar19 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar46._8_4_ = (uint)bVar19 * auVar43._8_4_ | (uint)!bVar19 * auVar37._8_4_;
            bVar19 = SUB81(uVar28 >> 3,0);
            auVar46._12_4_ = (uint)bVar19 * auVar43._12_4_ | (uint)!bVar19 * auVar37._12_4_;
            auVar37 = vmovdqa32_avx512vl(auVar45);
            bVar19 = (bool)((byte)uVar28 & 1);
            bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar28 >> 2) & 1);
            bVar10 = SUB81(uVar28 >> 3,0);
            *(uint *)puVar24 = (uint)bVar19 * auVar37._0_4_ | !bVar19 * auVar44._0_4_;
            *(uint *)((long)puVar24 + 4) = (uint)bVar7 * auVar37._4_4_ | !bVar7 * auVar44._4_4_;
            *(uint *)(puVar24 + 1) = (uint)bVar8 * auVar37._8_4_ | !bVar8 * auVar44._8_4_;
            *(uint *)((long)puVar24 + 0xc) =
                 (uint)bVar10 * auVar37._12_4_ | !bVar10 * auVar44._12_4_;
            *(undefined1 (*) [16])(puVar24 + 2) = auVar46;
            puVar24 = puVar24 + 4;
          }
          else {
            lVar26 = 0;
            for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              lVar26 = lVar26 + 1;
            }
            uVar22 = *(uint *)(local_1018 + lVar26 * 4);
            auVar56._8_8_ = 0;
            auVar56._0_8_ = *(ulong *)(uVar25 + lVar26 * 8);
            auVar48 = vpunpcklqdq_avx(auVar56,ZEXT416(uVar22));
            uVar29 = vpcmpgtd_avx512vl(auVar41,auVar39);
            uVar29 = uVar29 & 0xf;
            auVar38 = vpblendmd_avx512vl(auVar43,auVar37);
            bVar19 = (bool)((byte)uVar29 & 1);
            auVar41._0_4_ = (uint)bVar19 * auVar38._0_4_ | (uint)!bVar19 * auVar39._0_4_;
            bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar41._4_4_ = (uint)bVar19 * auVar38._4_4_ | (uint)!bVar19 * auVar39._4_4_;
            bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar41._8_4_ = (uint)bVar19 * auVar38._8_4_ | (uint)!bVar19 * auVar39._8_4_;
            bVar19 = SUB81(uVar29 >> 3,0);
            auVar41._12_4_ = (uint)bVar19 * auVar38._12_4_ | (uint)!bVar19 * auVar39._12_4_;
            auVar43 = vmovdqa32_avx512vl(auVar43);
            bVar19 = (bool)((byte)uVar29 & 1);
            auVar38._0_4_ = (uint)bVar19 * auVar43._0_4_ | (uint)!bVar19 * auVar37._0_4_;
            bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar38._4_4_ = (uint)bVar19 * auVar43._4_4_ | (uint)!bVar19 * auVar37._4_4_;
            bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar38._8_4_ = (uint)bVar19 * auVar43._8_4_ | (uint)!bVar19 * auVar37._8_4_;
            bVar19 = SUB81(uVar29 >> 3,0);
            auVar38._12_4_ = (uint)bVar19 * auVar43._12_4_ | (uint)!bVar19 * auVar37._12_4_;
            auVar55._4_4_ = uVar22;
            auVar55._0_4_ = uVar22;
            auVar55._8_4_ = uVar22;
            auVar55._12_4_ = uVar22;
            uVar29 = vpcmpgtd_avx512vl(auVar55,auVar47);
            uVar29 = uVar29 & 0xf;
            auVar37 = vpblendmd_avx512vl(auVar48,auVar49);
            bVar19 = (bool)((byte)uVar29 & 1);
            auVar47._0_4_ = (uint)bVar19 * auVar37._0_4_ | !bVar19 * uVar22;
            bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar47._4_4_ = (uint)bVar19 * auVar37._4_4_ | !bVar19 * uVar22;
            bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar47._8_4_ = (uint)bVar19 * auVar37._8_4_ | !bVar19 * uVar22;
            bVar19 = SUB81(uVar29 >> 3,0);
            auVar47._12_4_ = (uint)bVar19 * auVar37._12_4_ | !bVar19 * uVar22;
            auVar37 = vmovdqa32_avx512vl(auVar48);
            bVar19 = (bool)((byte)uVar29 & 1);
            auVar48._0_4_ = (uint)bVar19 * auVar37._0_4_ | (uint)!bVar19 * auVar49._0_4_;
            bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar48._4_4_ = (uint)bVar19 * auVar37._4_4_ | (uint)!bVar19 * auVar49._4_4_;
            bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar48._8_4_ = (uint)bVar19 * auVar37._8_4_ | (uint)!bVar19 * auVar49._8_4_;
            bVar19 = SUB81(uVar29 >> 3,0);
            auVar48._12_4_ = (uint)bVar19 * auVar37._12_4_ | (uint)!bVar19 * auVar49._12_4_;
            auVar37 = vpshufd_avx(auVar48,0xaa);
            auVar43 = vpshufd_avx(auVar38,0xaa);
            uVar29 = vpcmpgtd_avx512vl(auVar37,auVar43);
            uVar29 = uVar29 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar48,auVar38);
            bVar19 = (bool)((byte)uVar29 & 1);
            auVar49._0_4_ = (uint)bVar19 * auVar43._0_4_ | (uint)!bVar19 * auVar37._0_4_;
            bVar19 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar19 * auVar43._4_4_ | (uint)!bVar19 * auVar37._4_4_;
            bVar19 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar19 * auVar43._8_4_ | (uint)!bVar19 * auVar37._8_4_;
            bVar19 = SUB81(uVar29 >> 3,0);
            auVar49._12_4_ = (uint)bVar19 * auVar43._12_4_ | (uint)!bVar19 * auVar37._12_4_;
            auVar39 = vmovdqa32_avx512vl(auVar48);
            bVar19 = (bool)((byte)uVar29 & 1);
            bVar8 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar11 = SUB81(uVar29 >> 3,0);
            auVar37 = vpshufd_avx(auVar47,0xaa);
            auVar43 = vpshufd_avx(auVar41,0xaa);
            uVar28 = vpcmpgtd_avx512vl(auVar37,auVar43);
            uVar28 = uVar28 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar47,auVar41);
            bVar7 = (bool)((byte)uVar28 & 1);
            bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
            uVar29 = CONCAT44((uint)bVar10 * auVar43._4_4_ | (uint)!bVar10 * auVar37._4_4_,
                              (uint)bVar7 * auVar43._0_4_ | (uint)!bVar7 * auVar37._0_4_);
            auVar37 = vmovdqa32_avx512vl(auVar47);
            bVar7 = (bool)((byte)uVar28 & 1);
            auVar50._0_4_ = (uint)bVar7 * auVar37._0_4_ | !bVar7 * auVar41._0_4_;
            bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar50._4_4_ = (uint)bVar7 * auVar37._4_4_ | !bVar7 * auVar41._4_4_;
            bVar7 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar50._8_4_ = (uint)bVar7 * auVar37._8_4_ | !bVar7 * auVar41._8_4_;
            bVar7 = SUB81(uVar28 >> 3,0);
            auVar50._12_4_ = (uint)bVar7 * auVar37._12_4_ | !bVar7 * auVar41._12_4_;
            auVar37 = vpshufd_avx(auVar50,0xaa);
            auVar43 = vpshufd_avx(auVar49,0xaa);
            uVar28 = vpcmpgtd_avx512vl(auVar43,auVar37);
            uVar28 = uVar28 & 0xf;
            auVar43 = vpblendmd_avx512vl(auVar49,auVar50);
            bVar7 = (bool)((byte)uVar28 & 1);
            auVar51._0_4_ = (uint)bVar7 * auVar43._0_4_ | (uint)!bVar7 * auVar37._0_4_;
            bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar51._4_4_ = (uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar37._4_4_;
            bVar7 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar51._8_4_ = (uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * auVar37._8_4_;
            bVar7 = SUB81(uVar28 >> 3,0);
            auVar51._12_4_ = (uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * auVar37._12_4_;
            auVar37 = vmovdqa32_avx512vl(auVar49);
            bVar7 = (bool)((byte)uVar28 & 1);
            auVar52._0_4_ = (uint)bVar7 * auVar37._0_4_ | !bVar7 * auVar50._0_4_;
            bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar7 * auVar37._4_4_ | !bVar7 * auVar50._4_4_;
            bVar7 = (bool)((byte)(uVar28 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar7 * auVar37._8_4_ | !bVar7 * auVar50._8_4_;
            bVar7 = SUB81(uVar28 >> 3,0);
            auVar52._12_4_ = (uint)bVar7 * auVar37._12_4_ | !bVar7 * auVar50._12_4_;
            *(uint *)puVar24 = (uint)bVar19 * auVar39._0_4_ | !bVar19 * auVar38._0_4_;
            *(uint *)((long)puVar24 + 4) = (uint)bVar8 * auVar39._4_4_ | !bVar8 * auVar38._4_4_;
            *(uint *)(puVar24 + 1) = (uint)bVar9 * auVar39._8_4_ | !bVar9 * auVar38._8_4_;
            *(uint *)((long)puVar24 + 0xc) =
                 (uint)bVar11 * auVar39._12_4_ | !bVar11 * auVar38._12_4_;
            *(undefined1 (*) [16])(puVar24 + 2) = auVar52;
            *(undefined1 (*) [16])(puVar24 + 4) = auVar51;
            puVar24 = puVar24 + 6;
          }
        }
      }
      goto LAB_01ea93a7;
    }
    if (puVar24 == &local_f78) {
      return bVar20;
    }
  }
  auVar53 = ZEXT1664(local_ff8);
  goto LAB_01ea9949;
LAB_01ea9858:
  do {
    local_fd8 = uVar29;
    bVar23 = 0;
    lVar27 = 0;
    do {
      if (*(int *)(lVar26 + lVar27 * 4) == -1) break;
      uVar22 = *(uint *)(lVar26 + -0x10 + lVar27 * 4);
      this = (context->scene->geometries).items[uVar22].ptr;
      context->geomID = uVar22;
      context->primID = *(uint *)(lVar26 + lVar27 * 4);
      bVar19 = Geometry::pointQuery(this,query,context);
      auVar62 = ZEXT1664(local_fa8);
      auVar60 = ZEXT1664(local_f98);
      auVar58 = ZEXT1664(local_f88);
      bVar23 = bVar23 | bVar19;
      lVar27 = lVar27 + 1;
    } while (lVar27 != 4);
    uVar29 = CONCAT71((int7)(local_fd8 >> 8),(byte)local_fd8 | bVar23);
    local_fd0 = local_fd0 + 1;
    lVar26 = lVar26 + 0x50;
  } while (local_fd0 != local_fe0);
  if ((local_fd8 & 1) == 0 && bVar23 == 0) {
    auVar53 = ZEXT1664(local_ff8);
    auVar63 = ZEXT1664(local_fb8);
    auVar64 = ZEXT1664(local_fc8);
  }
  else {
    uVar3 = *(undefined4 *)&(context->query_radius).field_0;
    auVar53 = ZEXT1664(CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(uVar3,uVar3))));
    auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar63 = ZEXT1664(auVar30);
    auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar64 = ZEXT1664(auVar30);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1008 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar4 = (context->query_radius).field_0;
      local_1008 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    }
    bVar20 = true;
  }
LAB_01ea9949:
  auVar30._0_4_ = auVar53._0_4_ * auVar53._0_4_;
  auVar30._4_4_ = auVar53._4_4_ * auVar53._4_4_;
  auVar30._8_4_ = auVar53._8_4_ * auVar53._8_4_;
  auVar30._12_4_ = auVar53._12_4_ * auVar53._12_4_;
  if (puVar24 == &local_f78) {
    return bVar20;
  }
  goto LAB_01ea9362;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }